

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O2

Expression *
slang::ast::ConversionExpression::fromSyntax
          (Compilation *comp,CastExpressionSyntax *syntax,ASTContext *context,Type *assignmentTarget
          )

{
  SourceRange opRange;
  ConversionKind cast;
  Type *this;
  bool bVar1;
  bitmask<slang::ast::IntegralFlags> flags;
  int iVar2;
  undefined4 extraout_var;
  Expression *pEVar3;
  Expression *this_00;
  Symbol *pSVar4;
  optional<int> value;
  SourceLocation this_01;
  Diagnostic *diag;
  SourceLocation SVar5;
  Diagnostic *pDVar6;
  not_null<const_slang::ast::Type_*> parentExpr;
  ConversionExpression *pCVar7;
  bitmask<slang::ast::ASTFlags> bVar8;
  SourceRange SVar9;
  SourceRange sourceRange;
  undefined4 uStack_74;
  Expression *operand;
  not_null<const_slang::ast::Type_*> local_68;
  bitmask<slang::ast::ASTFlags> local_60;
  Type *local_58;
  anon_class_32_4_0791e916 result;
  
  iVar2 = Expression::bind((int)(syntax->left).ptr,(sockaddr *)context,4);
  pEVar3 = (Expression *)CONCAT44(extraout_var,iVar2);
  bVar1 = Expression::bad(pEVar3);
  if (bVar1) goto LAB_003cc7dc;
  if (pEVar3->kind == DataType) {
    this_01 = (SourceLocation)(pEVar3->type).ptr;
    local_68.ptr = (Type *)this_01;
    bVar1 = Type::isSimpleType((Type *)this_01);
    if ((((!bVar1) && (bVar1 = Type::isError((Type *)this_01), !bVar1)) &&
        (bVar1 = Type::isString((Type *)this_01), !bVar1)) &&
       ((((syntax->left).ptr)->super_SyntaxNode).kind != TypeReference)) {
      pDVar6 = ASTContext::addDiag(context,(DiagCode)0x200007,pEVar3->sourceRange);
      ast::operator<<(pDVar6,(Type *)this_01);
LAB_003cc7dc:
      pEVar3 = Expression::badExpr(comp,(Expression *)0x0);
      return pEVar3;
    }
    SVar5 = this_01;
    local_58 = assignmentTarget;
    this_00 = Expression::create(comp,(ExpressionSyntax *)(syntax->right).ptr,context,
                                 (bitmask<slang::ast::ASTFlags>)0x80,(Type *)this_01);
    operand = this_00;
    bVar1 = Expression::bad(this_00);
    if (bVar1) goto LAB_003cc7dc;
  }
  else {
    value = ASTContext::evalInteger(context,pEVar3,(bitmask<slang::ast::EvalFlags>)0x0);
    if ((((ulong)value.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int> >> 0x20 & 1) == 0) ||
       (bVar1 = ASTContext::requireGtZero(context,value,pEVar3->sourceRange), !bVar1))
    goto LAB_003cc7dc;
    bVar1 = ASTContext::requireValidBitWidth
                      (context,value.super__Optional_base<int,_true,_true>._M_payload.
                               super__Optional_payload_base<int>._M_payload,pEVar3->sourceRange);
    if (!bVar1) goto LAB_003cc7dc;
    SVar5 = (SourceLocation)0x0;
    local_58 = assignmentTarget;
    this_00 = Expression::create(comp,(ExpressionSyntax *)(syntax->right).ptr,context,
                                 (bitmask<slang::ast::ASTFlags>)0x80,(Type *)0x0);
    operand = this_00;
    bVar1 = Expression::bad(this_00);
    if (bVar1) goto LAB_003cc7dc;
    bVar1 = Type::isIntegral((this_00->type).ptr);
    if (!bVar1) {
      SVar5 = parsing::Token::location(&syntax->apostrophe);
      pDVar6 = ASTContext::addDiag(context,(DiagCode)0x250007,SVar5);
      ast::operator<<(pDVar6,(this_00->type).ptr);
      pDVar6 = Diagnostic::operator<<(pDVar6,pEVar3->sourceRange);
      Diagnostic::operator<<(pDVar6,this_00->sourceRange);
      goto LAB_003cc7dc;
    }
    flags = Type::getIntegralFlags((this_00->type).ptr);
    this_01 = (SourceLocation)
              Compilation::getType
                        (comp,value.super__Optional_base<int,_true,_true>._M_payload.
                              super__Optional_payload_base<int>._M_payload,flags);
    local_68.ptr = (Type *)this_01;
  }
  result.type = &local_68.ptr;
  result.operand = &operand;
  local_60.m_bits = (underlying_type)comp;
  result.comp = comp;
  result.syntax = syntax;
  bVar1 = Type::isCastCompatible((Type *)this_01,(this_00->type).ptr);
  if (bVar1) {
    bVar1 = Type::isMatching(local_68.ptr,(operand->type).ptr);
    this = local_58;
    bVar8.m_bits = local_60.m_bits;
    if ((bVar1) &&
       ((pSVar4 = Expression::getSymbolReference(operand,true), pSVar4 == (Symbol *)0x0 ||
        ((pSVar4->kind != Genvar && ((pSVar4->kind != Parameter || (pSVar4[5].field_0x34 == '\0'))))
        )))) {
      SVar5 = (SourceLocation)(operand->type).ptr;
      if (((local_68.ptr)->super_Symbol).kind == TypeAlias) {
        if ((SourceLocation)local_68.ptr == SVar5) {
LAB_003ccac4:
          if ((((this != (Type *)0x0) && (bVar1 = Type::isMatching(this,local_68.ptr), bVar1)) &&
              (operand->kind != ConditionalOp)) ||
             (bVar1 = actuallyNeededCast(local_68.ptr,operand), !bVar1)) {
            SVar5 = parsing::Token::location(&syntax->apostrophe);
            pDVar6 = ASTContext::addDiag(context,(DiagCode)0xd90007,SVar5);
            pDVar6 = ast::operator<<(pDVar6,(operand->type).ptr);
            pDVar6 = Diagnostic::operator<<(pDVar6,pEVar3->sourceRange);
            Diagnostic::operator<<(pDVar6,operand->sourceRange);
          }
        }
      }
      else if (*(int *)SVar5 != 0x23 || (SourceLocation)local_68.ptr == SVar5) goto LAB_003ccac4;
    }
    bVar1 = Type::isAssignmentCompatible(local_68.ptr,(operand->type).ptr);
    parentExpr.ptr = local_68.ptr;
    if (bVar1) {
      bVar1 = Type::isNumeric(local_68.ptr);
      if ((bVar1) && (bVar1 = Type::isNumeric((operand->type).ptr), bVar1)) {
        parentExpr.ptr =
             OpInfo::binaryType((Compilation *)bVar8.m_bits,local_68.ptr,(operand->type).ptr,false,
                                true);
      }
      SVar9 = parsing::Token::range(&syntax->apostrophe);
      opRange.startLoc._4_4_ = uStack_74;
      opRange.startLoc._0_4_ = 3;
      opRange.endLoc = (SourceLocation)operand;
      Expression::contextDetermined
                ((Expression *)context,(ASTContext *)&operand,(Expression **)0x0,
                 (Expression *)parentExpr.ptr,(Type *)SVar9.startLoc,opRange,SVar9.endLoc._0_4_);
      if ((operand->kind == Conversion) && (1 < (int)operand[1].kind)) {
        SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        operand->sourceRange = SVar9;
        (operand->type).ptr = local_68.ptr;
        return operand;
      }
    }
    else {
      Expression::selfDetermined(context,&operand);
    }
    cast = Explicit;
LAB_003ccc11:
    pCVar7 = fromSyntax::anon_class_32_4_0791e916::operator()(&result,cast);
  }
  else {
    SVar9.endLoc = SVar5;
    SVar9.startLoc = (pEVar3->sourceRange).endLoc;
    bVar1 = Bitstream::checkClassAccess
                      ((Bitstream *)local_68.ptr,(Type *)context,
                       (ASTContext *)(pEVar3->sourceRange).startLoc,SVar9);
    bVar8.m_bits = local_60.m_bits;
    if (bVar1) {
      if (operand->kind == Streaming) {
        bVar1 = Bitstream::isBitstreamCast(local_68.ptr,(StreamingConcatenationExpression *)operand)
        ;
        if (bVar1) {
LAB_003ccaa8:
          cast = BitstreamCast;
          goto LAB_003ccc11;
        }
        SVar5 = parsing::Token::location(&syntax->apostrophe);
        diag = ASTContext::addDiag(context,(DiagCode)0x290007,SVar5);
        pDVar6 = diag;
LAB_003ccc9e:
        ast::operator<<(diag,local_68.ptr);
        pDVar6 = Diagnostic::operator<<(pDVar6,pEVar3->sourceRange);
        Diagnostic::operator<<(pDVar6,operand->sourceRange);
      }
      else {
        bVar1 = Type::isBitstreamCastable(local_68.ptr,(operand->type).ptr);
        if (!bVar1) {
          SVar5 = parsing::Token::location(&syntax->apostrophe);
          pDVar6 = ASTContext::addDiag(context,(DiagCode)0x230007,SVar5);
          diag = ast::operator<<(pDVar6,(operand->type).ptr);
          goto LAB_003ccc9e;
        }
        sourceRange.endLoc = SVar5;
        sourceRange.startLoc = (operand->sourceRange).endLoc;
        bVar1 = Bitstream::checkClassAccess
                          ((Bitstream *)(operand->type).ptr,(Type *)context,
                           (ASTContext *)(operand->sourceRange).startLoc,sourceRange);
        if (bVar1) goto LAB_003ccaa8;
      }
      pCVar7 = fromSyntax::anon_class_32_4_0791e916::operator()(&result,Explicit);
    }
    else {
      pCVar7 = fromSyntax::anon_class_32_4_0791e916::operator()(&result,Explicit);
      bVar8.m_bits = local_60.m_bits;
    }
    pCVar7 = (ConversionExpression *)
             Expression::badExpr((Compilation *)bVar8.m_bits,&pCVar7->super_Expression);
  }
  return &pCVar7->super_Expression;
}

Assistant:

Expression& ConversionExpression::fromSyntax(Compilation& comp, const CastExpressionSyntax& syntax,
                                             const ASTContext& context,
                                             const Type* assignmentTarget) {
    auto& targetExpr = bind(*syntax.left, context, ASTFlags::AllowDataType);
    if (targetExpr.bad())
        return badExpr(comp, nullptr);

    auto type = &comp.getErrorType();
    Expression* operand;
    if (targetExpr.kind == ExpressionKind::DataType) {
        type = targetExpr.type;
        if (!type->isSimpleType() && !type->isError() && !type->isString() &&
            syntax.left->kind != SyntaxKind::TypeReference) {
            context.addDiag(diag::BadCastType, targetExpr.sourceRange) << *type;
            return badExpr(comp, nullptr);
        }

        operand = &create(comp, *syntax.right, context, ASTFlags::StreamingAllowed, type);
        if (operand->bad())
            return badExpr(comp, nullptr);
    }
    else {
        auto val = context.evalInteger(targetExpr);
        if (!val || !context.requireGtZero(val, targetExpr.sourceRange))
            return badExpr(comp, nullptr);

        bitwidth_t width = bitwidth_t(*val);
        if (!context.requireValidBitWidth(width, targetExpr.sourceRange))
            return badExpr(comp, nullptr);

        operand = &create(comp, *syntax.right, context, ASTFlags::StreamingAllowed);
        if (operand->bad())
            return badExpr(comp, nullptr);

        if (!operand->type->isIntegral()) {
            auto& diag = context.addDiag(diag::BadIntegerCast, syntax.apostrophe.location());
            diag << *operand->type;
            diag << targetExpr.sourceRange << operand->sourceRange;
            return badExpr(comp, nullptr);
        }

        type = &comp.getType(width, operand->type->getIntegralFlags());
    }

    auto result = [&](ConversionKind cast = ConversionKind::Explicit) {
        return comp.emplace<ConversionExpression>(*type, cast, *operand, syntax.sourceRange());
    };

    if (!type->isCastCompatible(*operand->type)) {
        if (!Bitstream::checkClassAccess(*type, context, targetExpr.sourceRange)) {
            return badExpr(comp, result());
        }

        if (operand->kind == ExpressionKind::Streaming) {
            if (!Bitstream::isBitstreamCast(*type,
                                            operand->as<StreamingConcatenationExpression>())) {
                auto& diag = context.addDiag(diag::BadStreamCast, syntax.apostrophe.location());
                diag << *type;
                diag << targetExpr.sourceRange << operand->sourceRange;
                return badExpr(comp, result());
            }
        }
        else if (!type->isBitstreamCastable(*operand->type)) {
            auto& diag = context.addDiag(diag::BadConversion, syntax.apostrophe.location());
            diag << *operand->type << *type;
            diag << targetExpr.sourceRange << operand->sourceRange;
            return badExpr(comp, result());
        }
        else if (!Bitstream::checkClassAccess(*operand->type, context, operand->sourceRange)) {
            return badExpr(comp, result());
        }

        return *result(ConversionKind::BitstreamCast);
    }

    // We have a useless cast if the type of the operand matches what we're casting to, unless:
    // - We needed the assignment-like context of the cast (like for an unpacked array concat)
    // - We weren't already in an assignment-like context of the correct type
    // - We're casting a genvar (people dislike seeing warnings about genvar operands)
    // - We're casting to a different typedef even if it's a matching underlying type
    auto isGenvar = [&] {
        if (auto sym = operand->getSymbolReference()) {
            return sym->kind == SymbolKind::Genvar || (sym->kind == SymbolKind::Parameter &&
                                                       sym->as<ParameterSymbol>().isFromGenvar());
        }
        return false;
    };

    auto isDifferentTypedef = [&] {
        return (type->isAlias() || operand->type->isAlias()) && type != operand->type;
    };

    if (type->isMatching(*operand->type) && !isGenvar() && !isDifferentTypedef() &&
        ((assignmentTarget && assignmentTarget->isMatching(*type) &&
          operand->kind != ExpressionKind::ConditionalOp) ||
         !actuallyNeededCast(*type, *operand))) {
        context.addDiag(diag::UselessCast, syntax.apostrophe.location())
            << *operand->type << targetExpr.sourceRange << operand->sourceRange;
    }

    if (type->isAssignmentCompatible(*operand->type)) {
        // The type we propagate should use the sign of the operand, just like it
        // would if we were doing an implicit conversion via an assignment expression.
        auto propagatedType = type;
        if (type->isNumeric() && operand->type->isNumeric()) {
            propagatedType = OpInfo::binaryType(comp, type, operand->type, false,
                                                /* signednessFromRt */ true);
        }

        contextDetermined(context, operand, nullptr, *propagatedType, syntax.apostrophe.range(),
                          ConversionKind::Explicit);

        if (operand->kind == ExpressionKind::Conversion &&
            !operand->as<ConversionExpression>().isImplicit()) {
            operand->sourceRange = syntax.sourceRange();
            operand->type = type;
            return *operand;
        }
    }
    else {
        selfDetermined(context, operand);
    }

    return *result();
}